

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiSmokeTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createSamplerTest(TestStatus *__return_storage_ptr__,Context *context)

{
  RefData<vk::Handle<(vk::HandleType)20>_> data;
  VkDevice device;
  DeviceInterface *vk_00;
  allocator<char> local_129;
  string local_128;
  RefData<vk::Handle<(vk::HandleType)20>_> local_108;
  undefined1 local_e8 [8];
  Unique<vk::Handle<(vk::HandleType)20>_> sampler;
  undefined1 local_b8 [8];
  Move<vk::Handle<(vk::HandleType)20>_> tmp2Sampler;
  Move<vk::Handle<(vk::HandleType)20>_> tmpSampler;
  VkSamplerCreateInfo samplerInfo;
  DeviceInterface *vk;
  VkDevice vkDevice;
  Context *context_local;
  
  device = Context::getDevice(context);
  vk_00 = Context::getDeviceInterface(context);
  tmpSampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x1f;
  ::vk::createSampler((Move<vk::Handle<(vk::HandleType)20>_> *)
                      &tmp2Sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.
                       m_allocator,vk_00,device,
                      (VkSamplerCreateInfo *)
                      &tmpSampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.
                       m_allocator,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)20>_>::Move
            ((Move<vk::Handle<(vk::HandleType)20>_> *)local_b8);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)20>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)20>_> *)local_b8,
             (Move<vk::Handle<(vk::HandleType)20>_> *)
             &tmp2Sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator)
  ;
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_108,(Move *)local_b8);
  data.deleter.m_deviceIface = local_108.deleter.m_deviceIface;
  data.object.m_internal = local_108.object.m_internal;
  data.deleter.m_device = local_108.deleter.m_device;
  data.deleter.m_allocator = local_108.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)20>_> *)local_e8,data);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)20>_> *)local_e8);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)20>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)20>_> *)local_b8);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)20>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)20>_> *)
             &tmp2Sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"Creating sampler succeeded",&local_129);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSamplerTest (Context& context)
{
	const VkDevice			vkDevice	= context.getDevice();
	const DeviceInterface&	vk			= context.getDeviceInterface();

	{
		const struct VkSamplerCreateInfo		samplerInfo	=
		{
			VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO,		// sType
			DE_NULL,									// pNext
			0u,											// flags
			VK_FILTER_NEAREST,							// magFilter
			VK_FILTER_NEAREST,							// minFilter
			VK_SAMPLER_MIPMAP_MODE_NEAREST,				// mipmapMode
			VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,		// addressModeU
			VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,		// addressModeV
			VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,		// addressModeW
			0.0f,										// mipLodBias
			VK_FALSE,									// anisotropyEnable
			1.0f,										// maxAnisotropy
			DE_FALSE,									// compareEnable
			VK_COMPARE_OP_ALWAYS,						// compareOp
			0.0f,										// minLod
			0.0f,										// maxLod
			VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK,	// borderColor
			VK_FALSE,									// unnormalizedCoords
		};

		Move<VkSampler>			tmpSampler	= createSampler(vk, vkDevice, &samplerInfo);
		Move<VkSampler>			tmp2Sampler;

		tmp2Sampler = tmpSampler;

		const Unique<VkSampler>	sampler		(tmp2Sampler);
	}

	return tcu::TestStatus::pass("Creating sampler succeeded");
}